

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O1

void RunMany(function<void_(int)> *fn,int count)

{
  pointer ptVar1;
  thread *t;
  undefined1 auVar2 [8];
  undefined1 auStack_48 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  auStack_48 = (undefined1  [8])0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48,(long)count);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  auVar2 = auStack_48;
  ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < count) {
    do {
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<std::function<void(int)>const&,int&>
                ((vector<std::thread,std::allocator<std::thread>> *)auStack_48,fn,
                 (int *)((long)&threads.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      auVar2 = auStack_48;
      ptVar1 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ < count);
  }
  for (; auVar2 != (undefined1  [8])ptVar1; auVar2 = (undefined1  [8])((long)auVar2 + 8)) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48);
  return;
}

Assistant:

static void RunMany(const std::function<void(int)>& fn, int count) {
    std::vector<std::thread> threads;
    threads.reserve(count);
    for (int i = 0; i < count; i++) {
      threads.emplace_back(fn, i);
    }
    for (auto& t : threads) {
      t.join();
    }
  }